

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall
Table_TableCannotBeMultiline3_Test::Table_TableCannotBeMultiline3_Test
          (Table_TableCannotBeMultiline3_Test *this)

{
  Table_TableCannotBeMultiline3_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Table_TableCannotBeMultiline3_Test_0022c0d8;
  return;
}

Assistant:

TEST(Table, TableCannotBeMultiline3) {
    std::istringstream input("[table.123\n.\"table\\ntable\"]");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(10, e.offset());
    }
}